

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

bool EV_MovePoly(line_t_conflict *line,int polyNum,double speed,DAngle *angle,double dist,
                bool overRide)

{
  FPolyObj *poly;
  DPolyAction *pDVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  FPolyMirrorIterator it;
  TAngle<double> local_1e0;
  DObject *local_1d8;
  FPolyMirrorIterator local_1d0;
  
  lVar2 = (long)po_NumPolyobjs;
  local_1d0.CurPoly = polyobjs;
  if (0 < lVar2) {
    do {
      if ((local_1d0.CurPoly)->tag == polyNum) goto LAB_00470ed2;
      lVar2 = lVar2 + -1;
      local_1d0.CurPoly = local_1d0.CurPoly + 1;
    } while (lVar2 != 0);
  }
  local_1d0.CurPoly = (FPolyObj *)0x0;
LAB_00470ed2:
  if (local_1d0.CurPoly == (FPolyObj *)0x0) {
    bVar4 = false;
    Printf("EV_MovePoly: Invalid polyobj num: %d\n");
  }
  else {
    local_1d0.UsedPolys[0] = (local_1d0.CurPoly)->tag;
    local_1d0.NumUsedPolys = 1;
    poly = FPolyMirrorIterator::NextMirror(&local_1d0);
    if (poly == (FPolyObj *)0x0) {
      bVar4 = false;
    }
    else {
      bVar3 = false;
      do {
        pDVar1 = (poly->specialdata).field_0.p;
        if (pDVar1 == (DPolyAction *)0x0) {
LAB_00470f4b:
          if (poly->bBlocked == true && !overRide) {
            return bVar3;
          }
        }
        else {
          if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (poly->specialdata).field_0.p = (DPolyAction *)0x0;
            goto LAB_00470f4b;
          }
          if (!overRide) {
            return bVar3;
          }
        }
        pDVar1 = (DPolyAction *)
                 M_Malloc_Dbg(0x70,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                              ,0x1f9);
        DPolyAction::DPolyAction(pDVar1,poly->tag);
        (pDVar1->super_DThinker).super_DObject._vptr_DObject =
             (_func_int **)&PTR_StaticType_00702db8;
        pDVar1[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
        pDVar1[1].super_DThinker.super_DObject.Class = (PClass *)0x0;
        pDVar1[1].super_DThinker.super_DObject.ObjNext = (DObject *)0x0;
        (poly->specialdata).field_0.p = pDVar1;
        poly->bBlocked = false;
        pDVar1->m_Dist = dist;
        pDVar1->m_Speed = speed;
        pDVar1[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)angle->Degrees;
        TAngle<double>::ToVector(&local_1e0,speed);
        pDVar1[1].super_DThinker.super_DObject.ObjNext = local_1d8;
        pDVar1[1].super_DThinker.super_DObject.Class = (PClass *)local_1e0.Degrees;
        SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
        if (dist / speed <= 2.0) {
          DPolyAction::StopInterpolation(pDVar1);
        }
        angle->Degrees = angle->Degrees + 180.0;
        poly = FPolyMirrorIterator::NextMirror(&local_1d0);
        bVar3 = true;
        bVar4 = true;
      } while (poly != (FPolyObj *)0x0);
    }
  }
  return bVar4;
}

Assistant:

bool EV_MovePoly (line_t *line, int polyNum, double speed, DAngle angle,
				  double dist, bool overRide)
{
	DMovePoly *pe = NULL;
	FPolyObj *poly;
	DAngle an = angle;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_MovePoly: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		pe = new DMovePoly(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		pe->m_Dist = dist; // Distance
		pe->m_Speed = speed;
		pe->m_Angle = angle;
		pe->m_Speedv = angle.ToVector(speed);
		SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);

		// Do not interpolate very fast moving polyobjects. The minimum tic count is
		// 3 instead of 2, because the moving crate effect in Massmouth 2, Hostitality
		// that this fixes isn't quite fast enough to move the crate back to its start
		// in just 1 tic.
		if (dist/speed <= 2)
		{
			pe->StopInterpolation ();
		}

		angle += 180.;	// Reverse the angle.
	}
	return pe != NULL;	// Return true if something started moving.
}